

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O0

void __thiscall
kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::moveFrom
          (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this,
          OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *other)

{
  bool t;
  bool t_1;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *other_local;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this_local;
  
  this->tag = other->tag;
  t = moveVariantFrom<kj::HttpInputStream::Request>(this,other);
  t_1 = moveVariantFrom<kj::HttpInputStream::Connect>(this,other);
  OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>::doAll<bool,bool>
            ((OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect> *)this,t,t_1);
  return;
}

Assistant:

void moveFrom(OneOf& other) {
    // Initialize as a copy of `other`.  Expects that `this` starts out uninitialized, so the tag
    // is invalid.
    tag = other.tag;
    doAll(moveVariantFrom<Variants>(other)...);
  }